

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

char * After_End_Of_Data(char *buf,int blen)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if ((buf != (char *)0x0) && (-1 < blen)) {
    pcVar3 = buf + (uint)blen;
    do {
      pcVar2 = pcVar3;
      if (pcVar3 <= buf) {
        return pcVar2;
      }
      pcVar1 = pcVar3 + -1;
      pcVar3 = pcVar3 + -1;
    } while (*pcVar1 == ' ');
    return pcVar2;
  }
  __assert_fail("buf && blen>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0xfb,"char *After_End_Of_Data(char *, int)");
}

Assistant:

INLINE static char *After_End_Of_Data(char * buf,int blen)
{
  char *p   = &buf[blen];
  
  assert(buf && blen>=0);
  while( (p>buf) && is_blank(p[-1]) ) 
    p--;
  return( p );
}